

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void processNode(xmllintState *lint,xmlTextReaderPtr reader)

{
  xmlPatternPtr pxVar1;
  xmlStreamCtxtPtr pxVar2;
  FILE *__stream;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int local_3c;
  int ret;
  int match;
  xmlChar *path;
  int empty;
  int type;
  xmlChar *value;
  xmlChar *name;
  xmlTextReaderPtr reader_local;
  xmllintState *lint_local;
  
  uVar4 = xmlTextReaderNodeType(reader);
  uVar5 = xmlTextReaderIsEmptyElement(reader);
  if (lint->debug != 0) {
    value = (xmlChar *)xmlTextReaderConstName(reader);
    if (value == (xmlChar *)0x0) {
      value = "--";
    }
    lVar9 = xmlTextReaderConstValue(reader);
    uVar6 = xmlTextReaderDepth(reader);
    uVar7 = xmlTextReaderHasValue(reader);
    printf("%d %d %s %d %d",(ulong)uVar6,(ulong)uVar4,value,(ulong)uVar5,(ulong)uVar7);
    if (lVar9 == 0) {
      printf("\n");
    }
    else {
      printf(" %s\n",lVar9);
    }
  }
  if (lint->patternc != (xmlPatternPtr)0x0) {
    _ret = 0;
    local_3c = -1;
    if (uVar4 == 1) {
      pxVar1 = lint->patternc;
      uVar10 = xmlTextReaderCurrentNode(reader);
      local_3c = xmlPatternMatch(pxVar1,uVar10);
      if (local_3c != 0) {
        uVar10 = xmlTextReaderCurrentNode(reader);
        _ret = xmlGetNodePath(uVar10);
        printf("Node %s matches pattern %s\n",_ret,lint->pattern);
      }
    }
    if (lint->patstream != (xmlStreamCtxtPtr)0x0) {
      if (uVar4 == 1) {
        pxVar2 = lint->patstream;
        uVar10 = xmlTextReaderConstLocalName(reader);
        uVar11 = xmlTextReaderConstNamespaceUri(reader);
        iVar8 = xmlStreamPush(pxVar2,uVar10,uVar11);
        if (iVar8 < 0) {
          fprintf((FILE *)lint->errStream,"xmlStreamPush() failure\n");
          xmlFreeStreamCtxt(lint->patstream);
          lint->patstream = (xmlStreamCtxtPtr)0x0;
        }
        else if (iVar8 != local_3c) {
          if (_ret == 0) {
            uVar10 = xmlTextReaderCurrentNode(reader);
            _ret = xmlGetNodePath(uVar10);
          }
          fprintf((FILE *)lint->errStream,"xmlPatternMatch and xmlStreamPush disagree\n");
          if (_ret == 0) {
            __stream = (FILE *)lint->errStream;
            pcVar3 = lint->pattern;
            uVar10 = xmlTextReaderConstName(reader);
            fprintf(__stream,"  pattern %s node %s\n",pcVar3,uVar10);
          }
          else {
            fprintf((FILE *)lint->errStream,"  pattern %s node %s\n",lint->pattern,_ret);
          }
        }
      }
      if (((uVar4 == 0xf) || ((uVar4 == 1 && (uVar5 != 0)))) &&
         (iVar8 = xmlStreamPop(lint->patstream), iVar8 < 0)) {
        fprintf((FILE *)lint->errStream,"xmlStreamPop() failure\n");
        xmlFreeStreamCtxt(lint->patstream);
        lint->patstream = (xmlStreamCtxtPtr)0x0;
      }
    }
    if (_ret != 0) {
      (*_xmlFree)(_ret);
    }
  }
  return;
}

Assistant:

static void processNode(xmllintState *lint, xmlTextReaderPtr reader) {
    const xmlChar *name, *value;
    int type, empty;

    type = xmlTextReaderNodeType(reader);
    empty = xmlTextReaderIsEmptyElement(reader);

    if (lint->debug) {
	name = xmlTextReaderConstName(reader);
	if (name == NULL)
	    name = BAD_CAST "--";

	value = xmlTextReaderConstValue(reader);


	printf("%d %d %s %d %d",
		xmlTextReaderDepth(reader),
		type,
		name,
		empty,
		xmlTextReaderHasValue(reader));
	if (value == NULL)
	    printf("\n");
	else {
	    printf(" %s\n", value);
	}
    }
#ifdef LIBXML_PATTERN_ENABLED
    if (lint->patternc) {
        xmlChar *path = NULL;
        int match = -1;

	if (type == XML_READER_TYPE_ELEMENT) {
	    /* do the check only on element start */
	    match = xmlPatternMatch(lint->patternc,
                                    xmlTextReaderCurrentNode(reader));

	    if (match) {
		path = xmlGetNodePath(xmlTextReaderCurrentNode(reader));
		printf("Node %s matches pattern %s\n", path, lint->pattern);
	    }
	}
	if (lint->patstream != NULL) {
	    int ret;

	    if (type == XML_READER_TYPE_ELEMENT) {
		ret = xmlStreamPush(lint->patstream,
		                    xmlTextReaderConstLocalName(reader),
				    xmlTextReaderConstNamespaceUri(reader));
		if (ret < 0) {
		    fprintf(lint->errStream, "xmlStreamPush() failure\n");
                    xmlFreeStreamCtxt(lint->patstream);
		    lint->patstream = NULL;
		} else if (ret != match) {
		    if (path == NULL) {
		        path = xmlGetNodePath(
		                       xmlTextReaderCurrentNode(reader));
		    }
		    fprintf(lint->errStream,
		            "xmlPatternMatch and xmlStreamPush disagree\n");
                    if (path != NULL)
                        fprintf(lint->errStream, "  pattern %s node %s\n",
                                lint->pattern, path);
                    else
		        fprintf(lint->errStream, "  pattern %s node %s\n",
			    lint->pattern, xmlTextReaderConstName(reader));
		}

	    }
	    if ((type == XML_READER_TYPE_END_ELEMENT) ||
	        ((type == XML_READER_TYPE_ELEMENT) && (empty))) {
	        ret = xmlStreamPop(lint->patstream);
		if (ret < 0) {
		    fprintf(lint->errStream, "xmlStreamPop() failure\n");
                    xmlFreeStreamCtxt(lint->patstream);
		    lint->patstream = NULL;
		}
	    }
	}
	if (path != NULL)
	    xmlFree(path);
    }
#endif
}